

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::has_alpha(image_u8 *img)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  
  uVar1 = img->m_height;
  bVar8 = uVar1 != 0;
  if (bVar8) {
    uVar3 = (ulong)img->m_width;
    uVar5 = 0;
    iVar6 = 1;
    do {
      if (uVar3 != 0) {
        bVar7 = uVar3 != 0;
        if (img->m_pPixels[img->m_pitch * uVar5].field_0.field_0.a == 0xff) {
          uVar4 = 0;
          do {
            if (uVar3 - 1 == uVar4) goto LAB_00119430;
            iVar2 = (int)uVar4;
            uVar4 = uVar4 + 1;
          } while (img->m_pPixels[(uint)(iVar6 + iVar2)].field_0.field_0.a == 0xff);
          bVar7 = uVar4 < uVar3;
        }
        if (bVar7) {
          return bVar8;
        }
      }
LAB_00119430:
      uVar5 = uVar5 + 1;
      iVar6 = iVar6 + img->m_pitch;
      bVar8 = uVar5 < uVar1;
    } while (uVar5 != uVar1);
  }
  return bVar8;
}

Assistant:

bool has_alpha(const image_u8& img)
        {
            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    if (img(x, y).a < 255)
                    {
                        return true;
                    }
                }
            }

            return false;
        }